

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSet.cpp
# Opt level: O2

bool __thiscall HSet::add(HSet *this,HighsInt entry)

{
  pointer piVar1;
  long lVar2;
  pointer piVar3;
  ulong uVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  
  if (entry < 0) {
    return false;
  }
  if (this->setup_ == false) {
    setup(this,1,entry,false,(FILE *)0x0,false,true);
  }
  uVar7 = (ulong)(uint)entry;
  if (this->max_entry_ < entry) {
    std::vector<int,_std::allocator<int>_>::resize(&this->pointer_,(ulong)(entry + 1));
    lVar2 = (long)this->max_entry_;
    piVar1 = (this->pointer_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    while (lVar2 = lVar2 + 1, lVar2 < (long)uVar7) {
      piVar1[lVar2] = -1;
    }
    this->max_entry_ = entry;
  }
  else {
    piVar1 = (this->pointer_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (-1 < piVar1[uVar7]) {
      bVar5 = false;
      if (this->debug_ == false) {
        return false;
      }
      goto LAB_00366fe1;
    }
  }
  piVar3 = (this->entry_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (long)(this->entry_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar3;
  iVar6 = this->count_;
  if (iVar6 == (int)(uVar4 >> 2)) {
    std::vector<int,_std::allocator<int>_>::resize
              (&this->entry_,(long)(uVar4 * 0x40000000 + 0x100000000) >> 0x20);
    iVar6 = this->count_;
    piVar1 = (this->pointer_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (this->entry_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  piVar1[uVar7] = iVar6;
  iVar6 = this->count_;
  this->count_ = iVar6 + 1;
  piVar3[iVar6] = entry;
  bVar5 = true;
  if (this->debug_ != true) {
    return true;
  }
LAB_00366fe1:
  debug(this);
  return bVar5;
}

Assistant:

bool HSet::add(const HighsInt entry) {
  if (entry < min_entry) return false;
  if (!setup_) setup(1, entry);
  if (entry > max_entry_) {
    // Entry exceeds what's allowable so far so can't be in the list
    pointer_.resize(entry + 1);
    for (HighsInt ix = max_entry_ + 1; ix < entry; ix++)
      pointer_[ix] = no_pointer;
    max_entry_ = entry;
  } else if (pointer_[entry] > no_pointer) {
    // Duplicate
    if (debug_) debug();
    return false;
  }
  // New entry
  HighsInt size = entry_.size();
  if (count_ == size) {
    size++;
    entry_.resize(size);
  }
  pointer_[entry] = count_;
  entry_[count_++] = entry;
  if (debug_) debug();
  return true;
}